

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O3

JSONNode __thiscall JSONNode::dump(JSONNode *this,size_t *totalmemory)

{
  char *pcVar1;
  size_t sVar2;
  internalJSONNode *this_00;
  size_t *psVar3;
  size_type __dnew;
  JSONNode local_50;
  undefined1 local_48 [32];
  
  sVar2 = *totalmemory;
  pcVar1 = local_48 + 0x10;
  local_48._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"no internal","");
  JSONDebug::_JSON_ASSERT(sVar2 != 0,(json_string *)local_48);
  if ((char *)local_48._0_8_ != pcVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  this_00 = (internalJSONNode *)operator_new(0x98);
  internalJSONNode::internalJSONNode(this_00,'\x05');
  this->internal = this_00;
  local_50.internal = (internalJSONNode *)0x16;
  local_48._0_8_ = pcVar1;
  local_48._0_8_ = std::__cxx11::string::_M_create((ulong *)local_48,(ulong)&local_50);
  local_48._16_8_ = local_50.internal;
  builtin_strncpy((char *)local_48._0_8_,"Not a proper JSON type",0x16);
  local_48._8_8_ = local_50.internal;
  *(char *)(local_48._0_8_ + (long)local_50.internal) = '\0';
  JSONDebug::_JSON_ASSERT(true,(json_string *)local_48);
  if ((char *)local_48._0_8_ != pcVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  psVar3 = getCtorCounter();
  *psVar3 = *psVar3 + 1;
  local_48._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"this","");
  JSONNode(&local_50,(json_string *)local_48,(long)totalmemory);
  push_back(this,&local_50);
  if (local_50.internal != (internalJSONNode *)0x0) {
    decRef(&local_50);
  }
  psVar3 = getDtorCounter();
  *psVar3 = *psVar3 + 1;
  if ((char *)local_48._0_8_ != pcVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  local_48._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"bytes used","");
  JSONNode(&local_50,(json_string *)local_48,8);
  push_back(this,&local_50);
  if (local_50.internal != (internalJSONNode *)0x0) {
    decRef(&local_50);
  }
  psVar3 = getDtorCounter();
  *psVar3 = *psVar3 + 1;
  if ((char *)local_48._0_8_ != pcVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  internalJSONNode::Dump((internalJSONNode *)local_48,(size_t *)*totalmemory);
  push_back(this,(JSONNode *)local_48);
  if ((char *)local_48._0_8_ != (char *)0x0) {
    decRef((JSONNode *)local_48);
  }
  psVar3 = getDtorCounter();
  *psVar3 = *psVar3 + 1;
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

inline JSONNode JSONNode::dump(size_t & totalmemory) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSONNode dumpage(JSON_NODE);
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("this"), (long)this)));
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("bytes used"), sizeof(JSONNode))));
		  dumpage.push_back(JSON_NEW(internal -> Dump(totalmemory)));
		  return dumpage;
	   }